

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::BlockSizes_ReadRaw_Test::BlockSizes_ReadRaw_Test
          (BlockSizes_ReadRaw_Test *this)

{
  BlockSizes_ReadRaw_Test *this_local;
  
  BlockSizes::BlockSizes(&this->super_BlockSizes);
  (this->super_BlockSizes).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)&PTR__BlockSizes_ReadRaw_Test_02a163c0;
  (this->super_BlockSizes).super_WithParamInterface<int>._vptr_WithParamInterface =
       (_func_int **)&DAT_02a16400;
  return;
}

Assistant:

TEST_P(BlockSizes, ReadRaw) {
  int kBlockSizes_case = GetParam();
  memcpy(buffer_, kRawBytes, sizeof(kRawBytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);
  char read_buffer[sizeof(kRawBytes)];

  {
    CodedInputStream coded_input(&input);

    EXPECT_TRUE(coded_input.ReadRaw(read_buffer, sizeof(kRawBytes)));
    EXPECT_EQ(0, memcmp(kRawBytes, read_buffer, sizeof(kRawBytes)));
  }

  EXPECT_EQ(sizeof(kRawBytes), input.ByteCount());
}